

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O0

void __thiscall sc_dt::sc_uint_subref::concat_set(sc_uint_subref *this,sc_signed *src,int low_i)

{
  bool bVar1;
  int iVar2;
  sc_uint_base *a;
  int in_EDX;
  sc_signed *in_RSI;
  sc_uint_subref_r *in_RDI;
  sc_uint_base aa;
  sc_uint_base *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 uVar3;
  sc_signed *in_stack_ffffffffffffff88;
  sc_uint_base *in_stack_ffffffffffffffa0;
  
  sc_uint_subref_r::length(in_RDI);
  sc_uint_base::sc_uint_base((sc_uint_base *)in_RDI,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
  ;
  iVar2 = sc_signed::length(in_RSI);
  if (in_EDX < iVar2) {
    sc_dt::operator>>(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    sc_uint_base::operator=(in_stack_ffffffffffffffa0,(sc_signed *)CONCAT44(iVar2,in_EDX));
    operator=((sc_uint_subref *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              in_stack_ffffffffffffff78);
    sc_signed::~sc_signed
              ((sc_signed *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  else {
    bVar1 = sc_dt::operator<((sc_signed *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
    a = sc_uint_base::operator=
                  ((sc_uint_base *)CONCAT44(uVar3,in_stack_ffffffffffffff80),
                   (int64)in_stack_ffffffffffffff78);
    operator=((sc_uint_subref *)CONCAT44(uVar3,in_stack_ffffffffffffff80),a);
  }
  sc_uint_base::~sc_uint_base((sc_uint_base *)0x28a95d);
  return;
}

Assistant:

void sc_uint_subref::concat_set(const sc_signed& src, int low_i)
{
    sc_uint_base aa( length() );
    if ( low_i < src.length() )
        *this = aa = src >> low_i;
    else
        *this = aa = (src < 0) ? (int_type)-1 : 0;
}